

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::VulkanMemoryConfig::Serialize(VulkanMemoryConfig *this,Message *msg)

{
  bool bVar1;
  void *data;
  size_t size;
  Message *msg_local;
  VulkanMemoryConfig *this_local;
  
  bVar1 = std::bitset<3UL>::operator[](&this->_has_field_,1);
  if (bVar1) {
    protozero::Message::AppendTinyVarInt(msg,1,(uint)(this->track_driver_memory_usage_ & 1));
  }
  bVar1 = std::bitset<3UL>::operator[](&this->_has_field_,2);
  if (bVar1) {
    protozero::Message::AppendTinyVarInt(msg,2,(uint)(this->track_device_memory_usage_ & 1));
  }
  data = (void *)::std::__cxx11::string::data();
  size = ::std::__cxx11::string::size();
  protozero::Message::AppendRawProtoBytes(msg,data,size);
  return;
}

Assistant:

void VulkanMemoryConfig::Serialize(::protozero::Message* msg) const {
  // Field 1: track_driver_memory_usage
  if (_has_field_[1]) {
    msg->AppendTinyVarInt(1, track_driver_memory_usage_);
  }

  // Field 2: track_device_memory_usage
  if (_has_field_[2]) {
    msg->AppendTinyVarInt(2, track_device_memory_usage_);
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}